

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

int netaddr_from_binary_prefix
              (netaddr *dst,void *binary,size_t len,uint8_t addr_type,uint8_t prefix_len)

{
  int iVar1;
  uint8_t local_22;
  uint8_t prefix_len_local;
  size_t sStack_20;
  uint8_t addr_type_local;
  size_t len_local;
  void *binary_local;
  netaddr *dst_local;
  
  memset(dst,0,0x10);
  sStack_20 = len;
  if (addr_type == '\0') {
    switch(len) {
    case 4:
      dst->_type = '\x02';
      break;
    default:
      dst->_type = '\0';
      if (0x10 < len) {
        sStack_20 = 0x10;
      }
      break;
    case 6:
      dst->_type = '/';
      break;
    case 8:
      dst->_type = '0';
      break;
    case 0x10:
      dst->_type = '\n';
    }
  }
  else {
    dst->_type = addr_type;
  }
  local_22 = prefix_len;
  if (prefix_len == 0xff) {
    local_22 = (uint8_t)(sStack_20 << 3);
  }
  dst->_prefix_len = local_22;
  memcpy(dst,binary,sStack_20);
  iVar1 = 0;
  if (dst->_type == '\0') {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
netaddr_from_binary_prefix(struct netaddr *dst, const void *binary, size_t len, uint8_t addr_type, uint8_t prefix_len) {
  memset(dst->_addr, 0, sizeof(dst->_addr));

  if (addr_type != 0) {
    dst->_type = addr_type;
  }
  else {
    switch (len) {
      case 4:
        dst->_type = AF_INET;
        break;
      case 6:
        dst->_type = AF_MAC48;
        break;
      case 8:
        dst->_type = AF_EUI64;
        break;
      case 16:
        dst->_type = AF_INET6;
        break;
      default:
        dst->_type = AF_UNSPEC;
        if (len > 16) {
          len = 16;
        }
        break;
    }
  }

  if (prefix_len == 255) {
    prefix_len = len << 3;
  }

  dst->_prefix_len = prefix_len;
  memcpy(dst->_addr, binary, len);

  return dst->_type == AF_UNSPEC ? -1 : 0;
}